

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

iterator __thiscall
google::protobuf::RepeatedField<bool>::erase
          (RepeatedField<bool> *this,const_iterator first,const_iterator last)

{
  void *pvVar1;
  LogMessage *other;
  int iVar2;
  int iVar3;
  void *__dest;
  size_t __n;
  LogMessage local_70;
  LogFinisher local_31;
  
  pvVar1 = this->arena_or_elements_;
  iVar2 = (int)first - (int)pvVar1;
  if (first != last) {
    __dest = (void *)((long)iVar2 + (long)pvVar1);
    __n = (long)pvVar1 + ((long)this->current_size_ - (long)last);
    if (__n != 0) {
      memmove(__dest,last,__n);
    }
    iVar3 = ((int)__dest + (int)__n) - *(int *)&this->arena_or_elements_;
    if (this->current_size_ < iVar3) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
                 ,0x63d);
      other = internal::LogMessage::operator<<
                        (&local_70,"CHECK failed: (new_size) <= (current_size_): ");
      internal::LogFinisher::operator=(&local_31,other);
      internal::LogMessage::~LogMessage(&local_70);
    }
    if (0 < this->current_size_) {
      this->current_size_ = iVar3;
    }
  }
  return (iterator)((long)iVar2 + (long)this->arena_or_elements_);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}